

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBarBufsToBuffers(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtkNew_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1ae,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->pDesign != (Abc_Des_t *)0x0) {
    __assert_fail("pNtk->pDesign == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1af,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1b0,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  iVar1 = pNtk->nBarBufs;
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != iVar2) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                  ,0x1b1,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  p = Abc_NtkToBarBufsCollect(pNtk);
  pNtkNew_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtkNew_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtkNew_00->pSpec = pcVar3;
  Abc_NtkCleanCopy(pNtk);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= local_34) {
      Vec_PtrFree(p);
      return pNtkNew_00;
    }
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,local_34);
    iVar1 = Abc_ObjIsPi(pAVar4);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsPo(pAVar4);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsBi(pAVar4);
        if ((iVar1 == 0) && (iVar1 = Abc_ObjIsBo(pAVar4), iVar1 == 0)) {
          iVar1 = Abc_ObjIsLatch(pAVar4);
          if (iVar1 == 0) {
            iVar1 = Abc_ObjIsNode(pAVar4);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                            ,0x1c9,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
            }
            Abc_NtkDupObj(pNtkNew_00,pAVar4,1);
            for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_38 < iVar1;
                local_38 = local_38 + 1) {
              pAVar5 = Abc_ObjFanin(pAVar4,local_38);
              Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar5->field_6).pCopy);
            }
          }
          else {
            pAVar5 = Abc_NtkCreateNode(pNtkNew_00);
            (pAVar4->field_6).pCopy = pAVar5;
            pAVar4 = Abc_ObjFanin0(pAVar4);
            Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
          }
        }
        else {
          pAVar5 = Abc_ObjFanin0(pAVar4);
          pAVar4->field_6 = pAVar5->field_6;
        }
      }
      else {
        pAVar5 = Abc_NtkDupObj(pNtkNew_00,pAVar4,1);
        pAVar4 = Abc_ObjFanin0(pAVar4);
        Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
      }
    }
    else {
      Abc_NtkDupObj(pNtkNew_00,pAVar4,1);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkBarBufsToBuffers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->pDesign == NULL );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Abc_NtkToBarBufsCollect( pNtk );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // create objects
    Abc_NtkCleanCopy( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsPi(pObj) )
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
        else if ( Abc_ObjIsPo( pObj) )
            Abc_ObjAddFanin( Abc_NtkDupObj(pNtkNew, pObj, 1), Abc_ObjFanin0(pObj)->pCopy );
        else if ( Abc_ObjIsBi(pObj) || Abc_ObjIsBo(pObj) )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        else if ( Abc_ObjIsLatch(pObj) )
            Abc_ObjAddFanin( (pObj->pCopy = Abc_NtkCreateNode(pNtkNew)), Abc_ObjFanin0(pObj)->pCopy );
        else if ( Abc_ObjIsNode(pObj) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
        else assert( 0 );
    }
    Vec_PtrFree( vNodes );
    return pNtkNew;
}